

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.h
# Opt level: O0

cmCommand * __thiscall cmMacroCommand::Clone(cmMacroCommand *this)

{
  cmCommand *this_00;
  cmMacroCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmMacroCommand((cmMacroCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmMacroCommand; }